

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O3

SimpleString BracketsFormattedHexString(SimpleString *hexString)

{
  size_t extraout_RDX;
  SimpleString SVar1;
  SimpleString local_48;
  SimpleString local_38;
  SimpleString local_28;
  
  local_28.buffer_ = (char *)0x0;
  local_28.bufferSize_ = 0;
  SimpleString::copyBufferToNewInternalBuffer(&local_28,"(0x");
  SimpleString::operator+(&local_38,&local_28);
  local_48.buffer_ = (char *)0x0;
  local_48.bufferSize_ = 0;
  SimpleString::copyBufferToNewInternalBuffer(&local_48,")");
  SimpleString::operator+(hexString,&local_38);
  SimpleString::deallocateInternalBuffer(&local_48);
  SimpleString::deallocateInternalBuffer(&local_38);
  SimpleString::deallocateInternalBuffer(&local_28);
  SVar1.bufferSize_ = extraout_RDX;
  SVar1.buffer_ = (char *)hexString;
  return SVar1;
}

Assistant:

SimpleString BracketsFormattedHexString(SimpleString hexString)
{
    return SimpleString("(0x") + hexString + ")" ;
}